

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pl_ASCII85Decoder.cc
# Opt level: O3

ssize_t __thiscall Pl_ASCII85Decoder::write(Pl_ASCII85Decoder *this,int __fd,void *__buf,size_t __n)

{
  byte bVar1;
  Pipeline *pPVar2;
  size_t sVar3;
  int iVar4;
  undefined8 in_RAX;
  ssize_t sVar5;
  ssize_t extraout_RAX;
  undefined4 extraout_var;
  ssize_t extraout_RAX_00;
  runtime_error *this_00;
  undefined4 in_register_00000034;
  void *pvVar6;
  bool bVar7;
  uchar zeroes [4];
  undefined4 local_2c;
  
  bVar7 = 1 < this->eod;
  sVar5 = CONCAT71((int7)((ulong)in_RAX >> 8),bVar7);
  if (__buf != (void *)0x0 && !bVar7) {
    pvVar6 = (void *)0x0;
    do {
      bVar1 = *(byte *)(CONCAT44(in_register_00000034,__fd) + (long)pvVar6);
      sVar5 = CONCAT71((int7)((ulong)sVar5 >> 8),bVar1);
      if ((4 < bVar1 - 9) && (bVar1 != 0x20)) {
        if (1 < this->eod) {
          return sVar5;
        }
        if (this->eod == 1) {
          if (bVar1 != 0x3e) {
            this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
            std::runtime_error::runtime_error(this_00,"broken end-of-data sequence in base 85 data")
            ;
LAB_001328a7:
            __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
          }
          flush(this);
          this->eod = 2;
          sVar5 = extraout_RAX;
        }
        else if (bVar1 == 0x7a) {
          if (this->pos != 0) {
            this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
            std::runtime_error::runtime_error(this_00,"unexpected z during base 85 decode");
            goto LAB_001328a7;
          }
          local_2c = 0;
          pPVar2 = (this->super_Pipeline).next_;
          iVar4 = (*pPVar2->_vptr_Pipeline[2])(pPVar2,&local_2c,4);
          sVar5 = CONCAT44(extraout_var,iVar4);
        }
        else if (bVar1 == 0x7e) {
          this->eod = 1;
        }
        else {
          if ((byte)(bVar1 + 0x8a) < 0xab) {
            this->error = true;
            this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
            std::runtime_error::runtime_error
                      (this_00,"character out of range during base 85 decode");
            goto LAB_001328a7;
          }
          sVar3 = this->pos;
          this->pos = sVar3 + 1;
          this->inbuf[sVar3] = bVar1;
          if (this->pos == 5) {
            flush(this);
            sVar5 = extraout_RAX_00;
          }
        }
      }
      pvVar6 = (void *)((long)pvVar6 + 1);
    } while (__buf != pvVar6);
  }
  return sVar5;
}

Assistant:

void
Pl_ASCII85Decoder::write(unsigned char const* buf, size_t len)
{
    if (eod > 1) {
        return;
    }
    for (size_t i = 0; i < len; ++i) {
        switch (buf[i]) {
        case ' ':
        case '\f':
        case '\v':
        case '\t':
        case '\r':
        case '\n':
            QTC::TC("libtests", "Pl_ASCII85Decoder ignore space");
            // ignore whitespace
            continue;
        }
        if (eod > 1) {
            break;
        } else if (eod == 1) {
            if (buf[i] == '>') {
                flush();
                eod = 2;
            } else {
                throw std::runtime_error("broken end-of-data sequence in base 85 data");
            }
        } else {
            switch (buf[i]) {
            case '~':
                eod = 1;
                break;

            case 'z':
                if (pos != 0) {
                    throw std::runtime_error("unexpected z during base 85 decode");
                } else {
                    QTC::TC("libtests", "Pl_ASCII85Decoder read z");
                    unsigned char zeroes[4];
                    memset(zeroes, '\0', 4);
                    next()->write(zeroes, 4);
                }
                break;

            default:
                if ((buf[i] < 33) || (buf[i] > 117)) {
                    error = true;
                    throw std::runtime_error("character out of range during base 85 decode");
                } else {
                    this->inbuf[this->pos++] = buf[i];
                    if (pos == 5) {
                        flush();
                    }
                }
                break;
            }
        }
    }
}